

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.hpp
# Opt level: O2

void __thiscall
SequenceDistanceGraph::SequenceDistanceGraph
          (SequenceDistanceGraph *this,SequenceDistanceGraph *param_1)

{
  pointer pNVar1;
  pointer pbVar2;
  
  DistanceGraph::DistanceGraph(&this->super_DistanceGraph,&param_1->super_DistanceGraph);
  pNVar1 = (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = pNVar1;
  (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->filename,(string *)&param_1->filename);
  std::__cxx11::string::string((string *)&this->fasta_filename,(string *)&param_1->fasta_filename);
  pbVar2 = (param_1->oldnames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->oldnames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
  (this->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->oldnames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->oldnames_to_ids)._M_h,&(param_1->oldnames_to_ids)._M_h);
  this->ws = param_1->ws;
  return;
}

Assistant:

explicit SequenceDistanceGraph(WorkSpace & _ws):nodes(0),DistanceGraph(*this,"SDG"),ws(_ws) { //sdg gets initialised through LDG
        add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    }